

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

HT_ErrorCode ht_stack_push(HT_Stack *stack,void *data,size_t size)

{
  HT_Boolean HVar1;
  long local_38;
  size_t factor;
  HT_ErrorCode bag_err_code;
  size_t size_local;
  void *data_local;
  HT_Stack *stack_local;
  
  if (stack->capacity - stack->size < size) {
    for (local_38 = 2; stack->capacity * local_38 - stack->size < size; local_38 = local_38 << 1) {
    }
    HVar1 = _ht_stack_resize(stack,stack->capacity * local_38);
    if (HVar1 == 0) {
      return HT_ERR_OUT_OF_MEMORY;
    }
  }
  stack_local._4_4_ = ht_bag_void_ptr_add(&stack->sizes_stack,(void *)stack->size);
  if (stack_local._4_4_ == HT_ERR_OK) {
    memcpy((void *)((long)stack->data + stack->size),data,size);
    stack->size = size + stack->size;
    stack_local._4_4_ = HT_ERR_OK;
  }
  return stack_local._4_4_;
}

Assistant:

HT_ErrorCode
ht_stack_push(HT_Stack* stack, void* data, size_t size)
{
    HT_ErrorCode bag_err_code = HT_ERR_OK;

    if (stack->capacity - stack->size < size)
    {
        size_t factor = 2;
        while (stack->capacity * factor - stack->size < size)
        {
            factor *= 2;
        }
        if (!_ht_stack_resize(stack, stack->capacity * factor))
        {
            return HT_ERR_OUT_OF_MEMORY;
        }
    }

    bag_err_code = ht_bag_void_ptr_add(&stack->sizes_stack, (void*)stack->size);
    if (bag_err_code != HT_ERR_OK)
    {
        return bag_err_code;
    }

    memcpy(HT_PTR_ADD(stack->data, stack->size), data, size);
    stack->size += size;

    return HT_ERR_OK;
}